

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPxr24Compressor.cpp
# Opt level: O0

int __thiscall
Imf_2_5::Pxr24Compressor::uncompress
          (Pxr24Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  bool bVar1;
  int iVar2;
  InputExc *this_00;
  int *piVar3;
  undefined4 *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  size_t k_1;
  char *pPtr_1;
  uint diff_2;
  int j_2;
  half *hPtr;
  uint diff_1;
  int j_1;
  size_t k;
  char *pPtr;
  uint diff;
  int j;
  uint pixel;
  uchar *ptr [4];
  int n;
  Channel *c;
  ConstIterator i;
  int y;
  char *writePtr;
  uchar *tmpBufferEnd;
  int maxY;
  int minY;
  int maxX;
  int minX;
  uLongf tmpSize;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  PixelType in_stack_fffffffffffffef4;
  ulong local_f0;
  int *local_e8;
  int local_dc;
  int local_cc;
  ulong local_c8;
  int *local_c0;
  int local_b0;
  int local_ac;
  byte *local_a8;
  byte *local_a0;
  byte *local_98;
  byte *local_90;
  int local_7c;
  Channel *local_78;
  const_iterator local_70;
  const_iterator local_68;
  int local_5c;
  half *local_58;
  byte *local_50;
  int local_48;
  int local_44;
  int local_40;
  undefined4 local_3c;
  ulong local_38;
  undefined8 *local_30;
  int local_4;
  
  if (in_EDX == 0) {
    *in_R8 = *(undefined8 *)(in_RDI + 0x20);
    local_4 = 0;
  }
  else {
    local_38 = (ulong)(*(int *)(in_RDI + 0x10) * *(int *)(in_RDI + 0x14));
    local_30 = in_R8;
    iVar2 = ::uncompress(*(undefined8 *)(in_RDI + 0x18),&local_38,in_RSI,(long)in_EDX);
    if (iVar2 != 0) {
      this_00 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(this_00,"Data decompression (zlib) failed.");
      __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    local_3c = *in_RCX;
    piVar3 = std::min<int>(in_RCX + 2,(int *)(in_RDI + 0x34));
    local_40 = *piVar3;
    local_44 = in_RCX[1];
    piVar3 = std::min<int>(in_RCX + 3,(int *)(in_RDI + 0x38));
    local_48 = *piVar3;
    local_50 = *(byte **)(in_RDI + 0x18);
    local_58 = *(half **)(in_RDI + 0x20);
    for (local_5c = local_44; local_5c <= local_48; local_5c = local_5c + 1) {
      local_68._M_node =
           (_Base_ptr)
           ChannelList::begin((ChannelList *)
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      while( true ) {
        local_70._M_node =
             (_Base_ptr)
             ChannelList::end((ChannelList *)
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        bVar1 = Imf_2_5::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        if (!bVar1) break;
        local_78 = ChannelList::ConstIterator::channel((ConstIterator *)0x8d8644);
        iVar2 = Imath_2_5::modp(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0);
        if (iVar2 == 0) {
          local_7c = numSamples(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
                                in_stack_fffffffffffffeec);
          local_ac = 0;
          in_stack_fffffffffffffef4 = local_78->type;
          if (in_stack_fffffffffffffef4 == UINT) {
            local_a8 = local_50;
            local_a0 = local_50 + local_7c;
            local_98 = local_a0 + local_7c;
            local_90 = local_98 + local_7c;
            local_50 = local_90 + local_7c;
            if (local_38 < (ulong)((long)local_50 - *(long *)(in_RDI + 0x18))) {
              anon_unknown_9::notEnoughData();
            }
            for (local_b0 = 0; local_b0 < local_7c; local_b0 = local_b0 + 1) {
              local_ac = ((uint)*local_a8 << 0x18 | (uint)*local_a0 << 0x10 | (uint)*local_98 << 8 |
                         (uint)*local_90) + local_ac;
              local_c0 = &local_ac;
              for (local_c8 = 0; local_c8 < 4; local_c8 = local_c8 + 1) {
                *(char *)&local_58->_h = (char)*local_c0;
                local_c0 = (int *)((long)local_c0 + 1);
                local_58 = (half *)((long)&local_58->_h + 1);
              }
              local_a8 = local_a8 + 1;
              local_a0 = local_a0 + 1;
              local_98 = local_98 + 1;
              local_90 = local_90 + 1;
            }
          }
          else if (in_stack_fffffffffffffef4 == HALF) {
            local_a8 = local_50;
            local_a0 = local_50 + local_7c;
            local_50 = local_a0 + local_7c;
            if (local_38 < (ulong)((long)local_50 - *(long *)(in_RDI + 0x18))) {
              anon_unknown_9::notEnoughData();
            }
            for (local_cc = 0; local_cc < local_7c; local_cc = local_cc + 1) {
              local_ac = (uint)CONCAT11(*local_a8,*local_a0) + local_ac;
              local_a8 = local_a8 + 1;
              local_a0 = local_a0 + 1;
              ::half::setBits(local_58,(unsigned_short)local_ac);
              local_58 = local_58 + 1;
            }
          }
          else if (in_stack_fffffffffffffef4 == FLOAT) {
            local_a8 = local_50;
            local_a0 = local_50 + local_7c;
            local_98 = local_a0 + local_7c;
            local_50 = local_98 + local_7c;
            if (local_38 < (ulong)((long)local_50 - *(long *)(in_RDI + 0x18))) {
              anon_unknown_9::notEnoughData();
            }
            for (local_dc = 0; local_dc < local_7c; local_dc = local_dc + 1) {
              local_ac = ((uint)*local_a8 << 0x18 | (uint)*local_a0 << 0x10 | (uint)*local_98 << 8)
                         + local_ac;
              local_e8 = &local_ac;
              for (local_f0 = 0; local_f0 < 4; local_f0 = local_f0 + 1) {
                *(char *)&local_58->_h = (char)*local_e8;
                local_e8 = (int *)((long)local_e8 + 1);
                local_58 = (half *)((long)&local_58->_h + 1);
              }
              local_a8 = local_a8 + 1;
              local_a0 = local_a0 + 1;
              local_98 = local_98 + 1;
            }
          }
        }
        ChannelList::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      }
    }
    if ((ulong)((long)local_50 - *(long *)(in_RDI + 0x18)) < local_38) {
      anon_unknown_9::tooMuchData();
    }
    *local_30 = *(undefined8 *)(in_RDI + 0x20);
    local_4 = (int)local_58 - (int)*(undefined8 *)(in_RDI + 0x20);
  }
  return local_4;
}

Assistant:

int		
Pxr24Compressor::uncompress (const char *inPtr,
			     int inSize,
			     Box2i range,
			     const char *&outPtr)
{
    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    uLongf tmpSize = _maxScanLineSize * _numScanLines;

    if (Z_OK != ::uncompress ((Bytef *)_tmpBuffer,
			      &tmpSize,
			      (const Bytef *) inPtr,
			      inSize))
    {
	throw IEX_NAMESPACE::InputExc ("Data decompression (zlib) failed.");
    }

    int minX = range.min.x;
    int maxX = min (range.max.x, _maxX);
    int minY = range.min.y;
    int maxY = min (range.max.y, _maxY);

    const unsigned char *tmpBufferEnd = _tmpBuffer;
    char *writePtr = _outBuffer;

    for (int y = minY; y <= maxY; ++y)
    {
	for (ChannelList::ConstIterator i = _channels.begin();
	     i != _channels.end();
	     ++i)
	{
	    const Channel &c = i.channel();

	    if (modp (y, c.ySampling) != 0)
		continue;

	    int n = numSamples (c.xSampling, minX, maxX);

	    const unsigned char *ptr[4];
	    unsigned int pixel = 0;

	    switch (c.type)
	    {
	      case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		ptr[2] = ptr[1] + n;
		ptr[3] = ptr[2] + n;
		tmpBufferEnd = ptr[3] + n;

		if ( (uLongf)(tmpBufferEnd - _tmpBuffer) > tmpSize)
		    notEnoughData();

		for (int j = 0; j < n; ++j)
		{
		    unsigned int diff = (*(ptr[0]++) << 24) |
					(*(ptr[1]++) << 16) |
					(*(ptr[2]++) <<  8) |
					 *(ptr[3]++);

		    pixel += diff;

		    char *pPtr = (char *) &pixel;

		    for (size_t k = 0; k < sizeof (pixel); ++k)
			*writePtr++ = *pPtr++;
		}

		break;

	      case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		tmpBufferEnd = ptr[1] + n;

        if ( (uLongf)(tmpBufferEnd - _tmpBuffer) > tmpSize)
		    notEnoughData();

		for (int j = 0; j < n; ++j)
		{
		    unsigned int diff = (*(ptr[0]++) << 8) |
					 *(ptr[1]++);

		    pixel += diff;

		    half * hPtr = (half *) writePtr;
		    hPtr->setBits ((unsigned short) pixel);
		    writePtr += sizeof (half);
		}

		break;

	      case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		ptr[2] = ptr[1] + n;
		tmpBufferEnd = ptr[2] + n;

        if ( (uLongf) (tmpBufferEnd - _tmpBuffer) > tmpSize)
		    notEnoughData();

		for (int j = 0; j < n; ++j)
		{
		    unsigned int diff = (*(ptr[0]++) << 24) |
					(*(ptr[1]++) << 16) |
					(*(ptr[2]++) <<  8);
		    pixel += diff;

		    char *pPtr = (char *) &pixel;

		    for (size_t k = 0; k < sizeof (pixel); ++k)
			*writePtr++ = *pPtr++;
		}

		break;

	      default:

		assert (false);
	    }
	}
    }

    if ((uLongf) (tmpBufferEnd - _tmpBuffer) < tmpSize)
	tooMuchData();

    outPtr = _outBuffer;
    return writePtr - _outBuffer;
}